

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# training.cc
# Opt level: O0

void __thiscall dynet::Trainer::update(Trainer *this)

{
  bool bVar1;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *this_00;
  ParameterStorage *pPVar2;
  const_reference ppPVar3;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *this_01
  ;
  Trainer *pTVar4;
  reference puVar5;
  L2WeightDecay *this_02;
  long *in_RDI;
  float fVar6;
  L2WeightDecay *wd;
  uint j;
  iterator __end3;
  iterator __begin3;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *__range3;
  value_type *p;
  size_t i_1;
  vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_> *lparams
  ;
  size_t i;
  vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_> *params;
  float gscale;
  Trainer *in_stack_00000160;
  ParameterStorage *this_03;
  _Node_iterator_base<unsigned_int,_false> in_stack_ffffffffffffffb0;
  _Node_iterator_base<unsigned_int,_false> local_48;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  *local_40;
  const_reference local_38;
  Trainer *this_04;
  Trainer *this_05;
  ParameterStorage *local_20;
  
  if ((*(byte *)((long)in_RDI + 0x25) & 1) == 0) {
    (**(code **)(*in_RDI + 0x20))();
    *(undefined1 *)((long)in_RDI + 0x25) = 1;
  }
  fVar6 = clip_gradients(in_stack_00000160);
  this_00 = ParameterCollection::parameters_list((ParameterCollection *)0xdb146b);
  local_20 = (ParameterStorage *)0x0;
  while (this_03 = local_20,
        pPVar2 = (ParameterStorage *)
                 std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>
                 ::size(this_00), this_03 < pPVar2) {
    ppPVar3 = std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::
              operator[](this_00,(size_type)local_20);
    if (((*ppPVar3)->updated & 1U) != 0) {
      (**(code **)(*in_RDI + 0x30))(fVar6,in_RDI,local_20);
      std::vector<dynet::ParameterStorage_*,_std::allocator<dynet::ParameterStorage_*>_>::operator[]
                (this_00,(size_type)local_20);
      ParameterStorage::clear(this_03);
    }
    local_20 = (ParameterStorage *)
               ((long)&(local_20->super_ParameterStorageBase)._vptr_ParameterStorageBase + 1);
  }
  this_01 = ParameterCollection::lookup_parameters_list((ParameterCollection *)0xdb1502);
  this_04 = (Trainer *)0x0;
  while (this_05 = this_04,
        pTVar4 = (Trainer *)
                 std::
                 vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
                 ::size(this_01), this_04 < pTVar4) {
    local_38 = std::
               vector<dynet::LookupParameterStorage_*,_std::allocator<dynet::LookupParameterStorage_*>_>
               ::operator[](this_01,(size_type)this_05);
    if ((((*(byte *)((long)in_RDI + 0x24) & 1) == 0) || (((*local_38)->updated & 1U) == 0)) ||
       (((*local_38)->all_updated & 1U) != 0)) {
      (**(code **)(*in_RDI + 0x40))(fVar6,in_RDI,this_05);
    }
    else {
      local_40 = &(*local_38)->non_zero_grads;
      local_48._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::begin((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                    *)this_04);
      in_stack_ffffffffffffffb0._M_cur =
           (__node_type *)
           std::
           unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
           ::end((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                  *)this_04);
      while (bVar1 = std::__detail::operator!=
                               (&local_48,
                                (_Node_iterator_base<unsigned_int,_false> *)&stack0xffffffffffffffb0
                               ), bVar1) {
        puVar5 = std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator*
                           ((_Node_iterator<unsigned_int,_true,_false> *)0xdb15d3);
        (**(code **)(*in_RDI + 0x38))(fVar6,in_RDI,this_05,*puVar5);
        std::__detail::_Node_iterator<unsigned_int,_true,_false>::operator++
                  ((_Node_iterator<unsigned_int,_true,_false> *)this_03);
      }
    }
    LookupParameterStorage::clear((LookupParameterStorage *)in_stack_ffffffffffffffb0._M_cur);
    this_04 = (Trainer *)((long)&((_Hashtable *)&this_05->_vptr_Trainer)->_M_buckets + 1);
  }
  *(float *)(in_RDI + 3) = *(float *)(in_RDI + 3) + 1.0;
  *(float *)(in_RDI + 4) = *(float *)(in_RDI + 4) + 1.0;
  this_02 = ParameterCollection::get_weight_decay((ParameterCollection *)0xdb166b);
  L2WeightDecay::update_weight_decay(this_02,(uint)((ulong)in_RDI >> 0x20));
  bVar1 = L2WeightDecay::parameters_need_rescaled(this_02);
  if (bVar1) {
    rescale_and_reset_weight_decay(this_05);
  }
  return;
}

Assistant:

void Trainer::update() {
  // Allocate if necessary
  if(!aux_allocated) {
    alloc_impl();
    aux_allocated = true;
  }

  // Perform gradient clipping and cycle through parameters
  const float gscale = clip_gradients();
  const auto & params = model->parameters_list();
  for(size_t i = 0; i < params.size(); ++i) {
    if(params[i]->updated) {
      update_params(gscale, i);
      params[i]->clear();
    }
  }
  const auto & lparams = model->lookup_parameters_list();
  for(size_t i = 0; i < lparams.size(); ++i) {
    auto &p = lparams[i];
    if(sparse_updates_enabled && p->updated && !p->all_updated) {
      for (auto j : p->non_zero_grads)
        update_lookup_params(gscale, i, j);
    } else {
      update_lookup_params(gscale, i);
    }
    p->clear();
  }
  ++updates;
  ++updates_since_status;

  L2WeightDecay & wd = model->get_weight_decay();
  wd.update_weight_decay(); // update global weight scale
  if (wd.parameters_need_rescaled())
    rescale_and_reset_weight_decay();  // if wdscale is getting to small multiply all weights by wdscale, and set wdscale to 1
}